

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

bool __thiscall spectest::JSONParser::Match(JSONParser *this,char *s)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  size_type sVar4;
  size_t sVar5;
  undefined8 uVar6;
  int iVar7;
  Location start_loc;
  
  SkipWhitespace(this);
  pcVar3 = (this->loc_).filename.data_;
  sVar4 = (this->loc_).filename.size_;
  sVar5 = (this->loc_).field_1.field_1.offset;
  uVar6 = *(undefined8 *)((long)&(this->loc_).field_1 + 8);
  sVar2 = this->json_offset_;
  while( true ) {
    cVar1 = *s;
    if (cVar1 == '\0') {
      return true;
    }
    iVar7 = ReadChar(this);
    if (iVar7 != cVar1) break;
    s = s + 1;
  }
  if (*s == '\0') {
    return true;
  }
  this->json_offset_ = sVar2;
  (this->loc_).field_1.field_1.offset = sVar5;
  *(undefined8 *)((long)&(this->loc_).field_1 + 8) = uVar6;
  (this->loc_).filename.data_ = pcVar3;
  (this->loc_).filename.size_ = sVar4;
  return false;
}

Assistant:

bool JSONParser::Match(const char* s) {
  SkipWhitespace();
  Location start_loc = loc_;
  size_t start_offset = json_offset_;
  while (*s && *s == ReadChar())
    s++;

  if (*s == 0) {
    return true;
  } else {
    json_offset_ = start_offset;
    loc_ = start_loc;
    return false;
  }
}